

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpBase::BeginSection
          (BinaryReaderObjdumpBase *this,Index section_index,BinarySection section_code,Offset size)

{
  value_type local_4;
  
  this->section_starts_[section_code] =
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  std::vector<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>::push_back
            (&this->section_types_,&local_4);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpBase::BeginSection(Index section_index,
                                             BinarySection section_code,
                                             Offset size) {
  section_starts_[static_cast<size_t>(section_code)] = state->offset;
  section_types_.push_back(section_code);
  return Result::Ok;
}